

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall ImFontAtlas::AddFont(ImFontAtlas *this,ImFontConfig *font_cfg)

{
  uint uVar1;
  int iVar2;
  ImFont **__src;
  ImFont *this_00;
  ImFont **__dest;
  ImFontConfig *pIVar3;
  void *__dest_00;
  int iVar4;
  long lVar5;
  char *__function;
  int iVar6;
  ImFontConfig *pIVar7;
  byte bVar8;
  
  bVar8 = 0;
  if ((font_cfg->FontData == (void *)0x0) || (font_cfg->FontDataSize < 1)) {
    __assert_fail("font_cfg->FontData != __null && font_cfg->FontDataSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x5d8,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if (font_cfg->SizePixels <= 0.0) {
    __assert_fail("font_cfg->SizePixels > 0.0f",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x5d9,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  if (font_cfg->MergeMode == false) {
    this_00 = (ImFont *)ImGui::MemAlloc(0x70);
    ImFont::ImFont(this_00);
    iVar6 = (this->Fonts).Size;
    iVar2 = (this->Fonts).Capacity;
    if (iVar6 == iVar2) {
      iVar6 = iVar6 + 1;
      if (iVar2 == 0) {
        iVar4 = 8;
      }
      else {
        iVar4 = iVar2 / 2 + iVar2;
      }
      if (iVar6 < iVar4) {
        iVar6 = iVar4;
      }
      if (iVar2 < iVar6) {
        __dest = (ImFont **)ImGui::MemAlloc((long)iVar6 << 3);
        __src = (this->Fonts).Data;
        if (__src != (ImFont **)0x0) {
          memcpy(__dest,__src,(long)(this->Fonts).Size << 3);
          ImGui::MemFree((this->Fonts).Data);
        }
        (this->Fonts).Data = __dest;
        (this->Fonts).Capacity = iVar6;
      }
    }
    (this->Fonts).Data[(this->Fonts).Size] = this_00;
    (this->Fonts).Size = (this->Fonts).Size + 1;
  }
  else if ((this->Fonts).Size == 0) {
    __assert_fail("!Fonts.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui_draw.cpp"
                  ,0x5df,"ImFont *ImFontAtlas::AddFont(const ImFontConfig *)");
  }
  iVar6 = (this->ConfigData).Size;
  iVar2 = (this->ConfigData).Capacity;
  if (iVar6 == iVar2) {
    iVar6 = iVar6 + 1;
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    if (iVar6 < iVar4) {
      iVar6 = iVar4;
    }
    if (iVar2 < iVar6) {
      pIVar3 = (ImFontConfig *)ImGui::MemAlloc((long)iVar6 << 7);
      pIVar7 = (this->ConfigData).Data;
      if (pIVar7 != (ImFontConfig *)0x0) {
        memcpy(pIVar3,pIVar7,(long)(this->ConfigData).Size << 7);
        ImGui::MemFree((this->ConfigData).Data);
      }
      (this->ConfigData).Data = pIVar3;
      (this->ConfigData).Capacity = iVar6;
    }
  }
  pIVar7 = font_cfg;
  pIVar3 = (this->ConfigData).Data + (this->ConfigData).Size;
  for (lVar5 = 0x10; lVar5 != 0; lVar5 = lVar5 + -1) {
    pIVar3->FontData = pIVar7->FontData;
    pIVar7 = (ImFontConfig *)((long)pIVar7 + (ulong)bVar8 * -0x10 + 8);
    pIVar3 = (ImFontConfig *)((long)pIVar3 + (ulong)bVar8 * -0x10 + 8);
  }
  iVar6 = (this->ConfigData).Size;
  uVar1 = iVar6 + 1;
  (this->ConfigData).Size = uVar1;
  if (-1 < iVar6) {
    pIVar7 = (this->ConfigData).Data;
    if (pIVar7[(ulong)uVar1 - 1].DstFont == (ImFont *)0x0) {
      lVar5 = (long)(this->Fonts).Size;
      if (lVar5 < 1) {
        __function = "value_type &ImVector<ImFont *>::back() [T = ImFont *]";
        goto LAB_0017da13;
      }
      pIVar7[(ulong)uVar1 - 1].DstFont = (this->Fonts).Data[lVar5 + -1];
    }
    if (pIVar7[(ulong)uVar1 - 1].FontDataOwnedByAtlas == false) {
      __dest_00 = ImGui::MemAlloc((long)pIVar7[(ulong)uVar1 - 1].FontDataSize);
      pIVar7[(ulong)uVar1 - 1].FontData = __dest_00;
      pIVar7[(ulong)uVar1 - 1].FontDataOwnedByAtlas = true;
      memcpy(__dest_00,font_cfg->FontData,(long)pIVar7[(ulong)uVar1 - 1].FontDataSize);
    }
    ClearTexData(this);
    return pIVar7[(ulong)uVar1 - 1].DstFont;
  }
  __function = "value_type &ImVector<ImFontConfig>::back() [T = ImFontConfig]";
LAB_0017da13:
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                ,0x4ca,__function);
}

Assistant:

ImFont* ImFontAtlas::AddFont(const ImFontConfig* font_cfg)
{
    IM_ASSERT(font_cfg->FontData != NULL && font_cfg->FontDataSize > 0);
    IM_ASSERT(font_cfg->SizePixels > 0.0f);

    // Create new font
    if (!font_cfg->MergeMode)
        Fonts.push_back(IM_NEW(ImFont));
    else
        IM_ASSERT(!Fonts.empty()); // When using MergeMode make sure that a font has already been added before. You can use ImGui::GetIO().Fonts->AddFontDefault() to add the default imgui font.

    ConfigData.push_back(*font_cfg);
    ImFontConfig& new_font_cfg = ConfigData.back();
    if (!new_font_cfg.DstFont)
        new_font_cfg.DstFont = Fonts.back();
    if (!new_font_cfg.FontDataOwnedByAtlas)
    {
        new_font_cfg.FontData = ImGui::MemAlloc(new_font_cfg.FontDataSize);
        new_font_cfg.FontDataOwnedByAtlas = true;
        memcpy(new_font_cfg.FontData, font_cfg->FontData, (size_t)new_font_cfg.FontDataSize);
    }

    // Invalidate texture
    ClearTexData();
    return new_font_cfg.DstFont;
}